

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_interval.cpp
# Opt level: O1

interval_t duckdb::ToYearsOperator::Operation<long,duckdb::interval_t>(long input)

{
  interval_t iVar1;
  bool bVar2;
  OutOfRangeException *this;
  undefined1 auVar3 [16];
  int result_1;
  interval_t result;
  int32_t local_54;
  string local_50;
  int32_t local_30;
  undefined4 uStack_2c;
  int64_t local_28;
  
  bVar2 = TryCast::Operation<long,int>(input,&local_54,false);
  if (!bVar2) {
    auVar3 = __cxa_allocate_exception(0x10);
    CastExceptionText<long,int>(&local_50,(duckdb *)input,auVar3._8_8_);
    InvalidInputException::InvalidInputException(auVar3._0_8_,(string *)&local_50);
    __cxa_throw(auVar3._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  uStack_2c = 0;
  local_28 = 0;
  bVar2 = TryMultiplyOperator::Operation<int,int,int>(local_54,0xc,&local_30);
  if (bVar2) {
    iVar1.days = uStack_2c;
    iVar1.months = local_30;
    iVar1.micros = local_28;
    return iVar1;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Interval value %d years out of range","");
  OutOfRangeException::OutOfRangeException<long>(this,&local_50,input);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA input) {
		const auto iinput = Cast::Operation<TA, int32_t>(input);
		interval_t result;
		result.days = 0;
		result.micros = 0;
		if (!TryMultiplyOperator::Operation<int32_t, int32_t, int32_t>(iinput, Interval::MONTHS_PER_YEAR,
		                                                               result.months)) {
			throw OutOfRangeException("Interval value %d years out of range", input);
		}
		return result;
	}